

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFNameTreeObjectHelper.cc
# Opt level: O0

void __thiscall
QPDFNameTreeObjectHelper::iterator::insertAfter(iterator *this,string *key,QPDFObjectHandle *value)

{
  element_type *this_00;
  QPDFObjectHandle local_40;
  QPDFObjectHandle local_30;
  QPDFObjectHandle *local_20;
  QPDFObjectHandle *value_local;
  string *key_local;
  iterator *this_local;
  
  local_20 = value;
  value_local = (QPDFObjectHandle *)key;
  key_local = (string *)this;
  this_00 = std::__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<NNTreeIterator,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&this->impl);
  QPDFObjectHandle::newUnicodeString(&local_30,(string *)value_local);
  QPDFObjectHandle::QPDFObjectHandle(&local_40,value);
  NNTreeIterator::insertAfter(this_00,&local_30,&local_40);
  QPDFObjectHandle::~QPDFObjectHandle(&local_40);
  QPDFObjectHandle::~QPDFObjectHandle(&local_30);
  updateIValue(this);
  return;
}

Assistant:

void
QPDFNameTreeObjectHelper::iterator::insertAfter(std::string const& key, QPDFObjectHandle value)
{
    impl->insertAfter(QPDFObjectHandle::newUnicodeString(key), value);
    updateIValue();
}